

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

QPoint __thiscall QAbstractScrollAreaPrivate::contentsOffset(QAbstractScrollAreaPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QPoint QVar4;
  QAbstractScrollAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractScrollArea *q;
  QPoint offset;
  undefined8 in_stack_ffffffffffffffc8;
  int ypos;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  ypos = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  bVar2 = QWidget::isVisible((QWidget *)0x499636);
  if (bVar2) {
    QAbstractSlider::value
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    QPoint::setY((QPoint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),ypos);
  }
  bVar2 = QWidget::isVisible((QWidget *)0x49966a);
  if (bVar2) {
    bVar2 = QWidget::isRightToLeft((QWidget *)0x49967a);
    if (bVar2) {
      iVar3 = QAbstractSlider::maximum
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      QAbstractSlider::value((QAbstractSlider *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      QPoint::setX((QPoint *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),ypos);
    }
    else {
      QAbstractSlider::value
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      QPoint::setX((QPoint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),ypos);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar4.xp.m_i = -0x55555556;
  QVar4.yp.m_i = -0x55555556;
  return QVar4;
}

Assistant:

QPoint QAbstractScrollAreaPrivate::contentsOffset() const
{
    Q_Q(const QAbstractScrollArea);
    QPoint offset;
    if (vbar->isVisible())
        offset.setY(vbar->value());
    if (hbar->isVisible()) {
        if (q->isRightToLeft())
            offset.setX(hbar->maximum() - hbar->value());
        else
            offset.setX(hbar->value());
    }
    return offset;
}